

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModel.c
# Opt level: O3

JL_NUM_TYPE JlIsObjectNumberHex(JlDataObject *NumberObject)

{
  JL_NUM_TYPE JVar1;
  
  JVar1 = JL_NUM_TYPE_NONE;
  if (((NumberObject != (JlDataObject *)0x0) && (NumberObject->Type == JL_DATA_TYPE_NUMBER)) &&
     ((NumberObject->field_2).Number.Type == JL_NUM_TYPE_UNSIGNED)) {
    JVar1 = (JL_NUM_TYPE)(NumberObject->field_2).Number.IsHex;
  }
  return JVar1;
}

Assistant:

JL_NUM_TYPE
    JlIsObjectNumberHex
    (
        JlDataObject const*     NumberObject
    )
{
    bool isHex = false;

    if(     NULL != NumberObject
        &&  JL_DATA_TYPE_NUMBER == NumberObject->Type
        &&  JL_NUM_TYPE_UNSIGNED == NumberObject->Number.Type )
    {
        isHex = NumberObject->Number.IsHex;
    }

    return isHex;
}